

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestInfo::Run(TestInfo *this)

{
  bool bVar1;
  TestEventListeners *this_00;
  TestEventListener *pTVar2;
  UnitTestImpl *this_01;
  TimeInMillis TVar3;
  OsStackTraceGetterInterface *pOVar4;
  Test *pTVar5;
  UnitTestImpl *in_RDI;
  char *in_stack_00000028;
  char *in_stack_00000030;
  offset_in_TestFactoryBase_to_subr in_stack_00000038;
  Test *test;
  Timer timer;
  UnitTestImpl *impl;
  TestEventListener *repeater;
  Timer *in_stack_ffffffffffffffa0;
  TestResult *pTVar6;
  Test *this_02;
  
  UnitTest::GetInstance();
  this_00 = UnitTest::listeners((UnitTest *)0x166550);
  pTVar2 = TestEventListeners::repeater(this_00);
  if (((in_RDI->global_test_part_result_reporter_mutex_).super_MutexBase.has_owner_ & 1U) == 0) {
    if ((((in_RDI->global_test_part_result_reporter_mutex_).super_MutexBase.field_0x29 & 1) != 0) &&
       (((in_RDI->global_test_part_result_reporter_mutex_).super_MutexBase.field_0x2a & 1) != 0)) {
      (*pTVar2->_vptr_TestEventListener[9])(pTVar2,in_RDI);
    }
  }
  else {
    this_01 = internal::GetUnitTestImpl();
    internal::UnitTestImpl::set_current_test_info(this_01,(TestInfo *)in_RDI);
    (*pTVar2->_vptr_TestEventListener[8])(pTVar2,in_RDI);
    pTVar6 = (TestResult *)&in_RDI->per_thread_test_part_result_reporter_;
    TVar3 = internal::GetTimeInMillis();
    TestResult::set_start_timestamp(pTVar6,TVar3);
    internal::Timer::Timer(in_stack_ffffffffffffffa0);
    pOVar4 = internal::UnitTestImpl::os_stack_trace_getter(in_RDI);
    (*pOVar4->_vptr_OsStackTraceGetterInterface[3])();
    this_02 = (Test *)0x0;
    pTVar5 = internal::
             HandleExceptionsInMethodIfSupported<testing::internal::TestFactoryBase,testing::Test*>
                       ((TestFactoryBase *)timer.start_.__d.__r,in_stack_00000038,in_stack_00000030)
    ;
    bVar1 = Test::HasFatalFailure();
    if ((!bVar1) && (bVar1 = Test::IsSkipped(), !bVar1)) {
      Test::Run(this_02);
    }
    if (pTVar5 != (Test *)0x0) {
      pOVar4 = internal::UnitTestImpl::os_stack_trace_getter(in_RDI);
      (*pOVar4->_vptr_OsStackTraceGetterInterface[3])();
      internal::HandleExceptionsInMethodIfSupported<testing::Test,void>
                (test,(offset_in_Test_to_subr)in_stack_00000030,in_stack_00000028);
    }
    pTVar6 = (TestResult *)&in_RDI->per_thread_test_part_result_reporter_;
    TVar3 = internal::Timer::Elapsed((Timer *)in_RDI);
    TestResult::set_elapsed_time(pTVar6,TVar3);
    (*pTVar2->_vptr_TestEventListener[0xb])(pTVar2,in_RDI);
    internal::UnitTestImpl::set_current_test_info(this_01,(TestInfo *)0x0);
  }
  return;
}

Assistant:

void TestInfo::Run() {
  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();
  if (!should_run_) {
    if (is_disabled_ && matches_filter_) repeater->OnTestDisabled(*this);
    return;
  }

  // Tells UnitTest where to store test result.
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_info(this);

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*this);
  result_.set_start_timestamp(internal::GetTimeInMillis());
  internal::Timer timer;
  impl->os_stack_trace_getter()->UponLeavingGTest();

  // Creates the test object.
  Test* const test = internal::HandleExceptionsInMethodIfSupported(
      factory_, &internal::TestFactoryBase::CreateTest,
      "the test fixture's constructor");

  // Runs the test if the constructor didn't generate a fatal failure or invoke
  // GTEST_SKIP().
  // Note that the object will not be null
  if (!Test::HasFatalFailure() && !Test::IsSkipped()) {
    // This doesn't throw as all user code that can throw are wrapped into
    // exception handling code.
    test->Run();
  }

  if (test != nullptr) {
    // Deletes the test object.
    impl->os_stack_trace_getter()->UponLeavingGTest();
    internal::HandleExceptionsInMethodIfSupported(
        test, &Test::DeleteSelf_, "the test fixture's destructor");
  }

  result_.set_elapsed_time(timer.Elapsed());

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*this);

  // Tells UnitTest to stop associating assertion results to this
  // test.
  impl->set_current_test_info(nullptr);
}